

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O3

MPP_RET hal_vp9d_prob_default(void *buf,void *dxva)

{
  ushort uVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  RK_U64 *pRVar5;
  int iVar6;
  undefined8 *puVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  BitputCtx_t bp;
  vp9_prob partition_probs [16] [3];
  long local_b8;
  BitputCtx_t local_a8;
  void *local_88;
  long local_80;
  RK_U64 *local_78;
  void *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = *(ushort *)((long)dxva + 2);
  local_70 = buf;
  memset(buf,0,0x1300);
  if ((uVar1 & 0x81) != 1) {
    *(undefined2 *)((long)dxva + 0x187) = 0xd34;
    *(undefined4 *)((long)dxva + 0x183) = 0x5258803;
    *(undefined8 *)((long)dxva + 0x189) = 0x80c04264650f9814;
    *(undefined1 *)((long)dxva + 0x191) = 0x40;
    memcpy((void *)((long)dxva + 0x207),vp9_default_coef_probs,0x6c0);
  }
  local_68 = *(undefined8 *)((long)dxva + 0x1d7);
  uStack_60 = *(undefined8 *)((long)dxva + 0x1df);
  local_58 = *(undefined8 *)((long)dxva + 0x1e7);
  uStack_50 = *(undefined8 *)((long)dxva + 0x1ef);
  local_48 = *(undefined8 *)((long)dxva + 0x1f7);
  uStack_40 = *(undefined8 *)((long)dxva + 0x1ff);
  puVar7 = &local_68;
  pRVar5 = (RK_U64 *)mpp_osal_calloc("hal_vp9d_prob_default",0x1300);
  lVar11 = 0;
  memset(pRVar5,0,0x260);
  local_78 = pRVar5;
  mpp_set_bitput_ctx(&local_a8,pRVar5,0x260);
  do {
    lVar13 = -3;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)((long)puVar7 + lVar13 + 3),8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0);
    lVar11 = lVar11 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 3);
  } while (lVar11 != 0x10);
  iVar6 = 3;
  do {
    mpp_put_bits(&local_a8,0,8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 7;
  do {
    mpp_put_bits(&local_a8,0,8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 + 399),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar13 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar13 + lVar11 * 3 + 0x183),8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar11 = 1;
    bVar4 = false;
  } while (bVar9);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x189),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x18a),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x18b),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x18c),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x18d),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + 0x18e),8);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 + 0x16b),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  lVar11 = (long)dxva + 0xd0;
  lVar13 = 0;
  mpp_put_align(&local_a8,0x80,0);
  do {
    lVar14 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar11 + lVar14),8);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 9);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 9;
  } while (lVar13 != 4);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 + 0x16f),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 + 0x17e),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 * 2 + 0x174),8);
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 * 2 + 0x175),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  lVar11 = (long)dxva + 0x156;
  lVar13 = 0;
  do {
    lVar14 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar11 + lVar14),8);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 3;
  } while (lVar13 != 7);
  lVar11 = 0;
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 * 2 + 0x14e),8);
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)dxva + lVar11 * 2 + 0x14f),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  lVar11 = 0;
  mpp_put_align(&local_a8,0x80,0);
  local_b8 = (long)dxva + 0x207;
  local_88 = dxva;
  do {
    lVar13 = 0;
    local_80 = lVar11;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      lVar13 = lVar13 * 0xd8 + local_b8;
      lVar11 = 0;
      iVar6 = 0;
      do {
        lVar8 = 0;
        lVar14 = lVar13;
        do {
          lVar10 = -3;
          do {
            mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar14 + 3 + lVar10),8);
            iVar6 = iVar6 + 1;
            if (iVar6 == 0x1b) {
              iVar6 = 0;
              mpp_put_align(&local_a8,0x80,0);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0);
          lVar8 = lVar8 + 1;
          lVar14 = lVar14 + 3;
        } while (lVar8 != 6);
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + 0x12;
      } while (lVar11 != 6);
      mpp_put_align(&local_a8,0x80,0);
      lVar13 = 1;
      bVar4 = false;
    } while (bVar9);
    lVar11 = local_80 + 1;
    local_b8 = local_b8 + 0x1b0;
  } while (lVar11 != 4);
  local_b8 = (long)local_88 + 0x273;
  lVar11 = 0;
  do {
    lVar13 = 0;
    local_80 = lVar11;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      lVar13 = lVar13 * 0xd8 + local_b8;
      lVar11 = 0;
      iVar6 = 0;
      do {
        lVar8 = 0;
        lVar14 = lVar13;
        do {
          lVar10 = -3;
          do {
            mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar14 + 3 + lVar10),8);
            iVar6 = iVar6 + 1;
            if (iVar6 == 0x1b) {
              iVar6 = 0;
              mpp_put_align(&local_a8,0x80,0);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0);
          lVar8 = lVar8 + 1;
          lVar14 = lVar14 + 3;
        } while (lVar8 != 6);
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + 0x12;
      } while (lVar11 != 6);
      mpp_put_align(&local_a8,0x80,0);
      pvVar2 = local_88;
      lVar13 = 1;
      bVar4 = false;
    } while (bVar9);
    lVar11 = local_80 + 1;
    local_b8 = local_b8 + 0x1b0;
  } while (lVar11 != 4);
  lVar11 = (long)local_88 + 0xf4;
  lVar13 = 0;
  do {
    lVar14 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar11 + lVar14),8);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 9);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 9;
  } while (lVar13 != 3);
  mpp_put_align(&local_a8,0x80,0);
  lVar11 = (long)pvVar2 + 0x10f;
  lVar13 = 3;
  do {
    lVar14 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar11 + lVar14),8);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 9);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 9;
  } while (lVar13 != 6);
  mpp_put_align(&local_a8,0x80,0);
  lVar11 = (long)pvVar2 + 0x12a;
  lVar13 = 6;
  do {
    lVar14 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)(lVar11 + lVar14),8);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 9);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 9;
  } while (lVar13 != 9);
  lVar11 = 0;
  mpp_put_align(&local_a8,0x80,0);
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + lVar11 + 0x145),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 9);
  lVar11 = 0;
  mpp_put_align(&local_a8,0x80,0);
  mpp_put_bits(&local_a8,0,8);
  mpp_put_align(&local_a8,0x80,0);
  do {
    mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + lVar11 + 0x192),8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + 0x195),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + 0x1b6),8);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar13 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + lVar13 + lVar11 * 0x21 + 0x196),8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10);
    lVar11 = 1;
    bVar4 = false;
  } while (bVar9);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + 0x1a0),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + 0x1c1),8);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar13 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + lVar13 + lVar11 * 0x21 + 0x1a1),8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10);
    lVar11 = 1;
    bVar4 = false;
  } while (bVar9);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar13 = lVar11 * 0x21;
    lVar11 = 0;
    bVar4 = true;
    do {
      bVar12 = bVar4;
      lVar14 = -3;
      do {
        mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar2 + lVar14 + lVar11 * 3 + lVar13 + 0x1ae)
                     ,8);
        pvVar3 = local_88;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      lVar11 = 1;
      bVar4 = false;
    } while (bVar12);
    bVar4 = false;
  } while (bVar9);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar13 = 0;
    do {
      mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar3 + lVar13 + lVar11 * 0x21 + 0x1b1),8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar11 = 1;
    bVar4 = false;
  } while (bVar9);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar3 + 0x1b4),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar3 + 0x1d5),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar3 + 0x1b5),8);
  mpp_put_bits(&local_a8,(ulong)*(byte *)((long)pvVar3 + 0x1d6),8);
  mpp_put_align(&local_a8,0x80,0);
  mpp_put_bits(&local_a8,0,8);
  mpp_put_align(&local_a8,0x80,0);
  pRVar5 = local_78;
  memcpy(local_70,local_78,0x1300);
  mpp_osal_free("hal_vp9d_prob_default",pRVar5);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_prob_default(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = PROB_SIZE >> 3;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    memset(buf, 0, PROB_SIZE);

    if (intraFlag) {
        memcpy(&pic_param->prob.tx32p, &vp9_default_probs.tx32p, sizeof(vp9_default_probs.tx32p));
        memcpy(&pic_param->prob.tx16p, &vp9_default_probs.tx16p, sizeof(vp9_default_probs.tx16p));
        memcpy(&pic_param->prob.tx8p,  &vp9_default_probs.tx8p, sizeof(vp9_default_probs.tx8p));
        memcpy(&pic_param->prob.skip,  &vp9_default_probs.skip, sizeof(vp9_default_probs.skip));
        memcpy(&pic_param->prob.coef,  &vp9_default_coef_probs, sizeof(vp9_default_coef_probs));
    }
    memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));

    probe_packet = mpp_calloc(RK_U64, fifo_len);
    memset(probe_packet, 0, fifo_len);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);

    //sb info  5 x 128 bit
    for (i = 0; i < 16; i++) //kf_partition_prob
        for (j = 0; j < 3; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, 0, 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, 0, 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);

    //intra_y_mode & inter_block info   6 x 128 bit
    for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

    for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
        mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
        mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
        for (j = 0; j < 2; j++)
            mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

    for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
        for (j = 0; j < INTER_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


    for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
        for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

    mpp_put_align(&bp, 128, 0);

    //128 x 128bit
    //coeff releated
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++)
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }
            }
            mpp_put_align(&bp, 128, 0);
        }
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++) {
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }

                }
            }
            mpp_put_align(&bp, 128, 0);
        }

    //intra uv mode 6 x 128
    for (i = 0; i < 3; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 6; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 9; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);
    for (; i < INTRA_MODES; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);

    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    //mv releated 6 x 128
    for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
        mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

    for (i = 0; i < 2; i++) { //sign bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
    }
    for (i = 0; i < 2; i++) { //classes bit
        for (j = 0; j < MV_CLASSES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
    }
    for (i = 0; i < 2; i++) { //classe0 bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
    }
    for (i = 0; i < 2; i++) { // bits
        for (j = 0; j < MV_OFFSET_BITS; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_fp bit
        for (j = 0; j < CLASS0_SIZE; j++)
            for (k = 0; k < MV_FP_SIZE - 1; k++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
    }
    for (i = 0; i < 2; i++) { //comp ref bit
        for (j = 0; j < MV_FP_SIZE - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_hp bit

        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
    }
    for (i = 0; i < 2; i++) { //hp bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
    }
    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    memcpy(buf, probe_packet, fifo_len << 3);

#if VP9_DUMP
    {
        static RK_U32 file_cnt = 0;
        char file_name[128];
        sprintf(file_name, "/data/vp9/prob_default_%d.txt", file_cnt);
        FILE *vp9_fp = fopen(file_name, "wb");
        RK_U32 *tmp = (RK_U32 *)buf;
        for (i = 0; i < bp.index * 2; i += 2) {
            fprintf(vp9_fp, "%08x%08x\n", tmp[i + 1], tmp[i]);
        }
        file_cnt++;
        fflush(vp9_fp);
        fclose(vp9_fp);
    }
#endif
    MPP_FREE(probe_packet);

    return 0;
}